

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx2::GridMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRefMB> *prims,
          mvector<SubGridBuildData> *sgrids,BBox1f *t0t1,range<unsigned_long> *r,size_t k,
          uint geomID)

{
  undefined8 uVar1;
  BBox1f BVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  size_t sVar6;
  PrimRefMB *pPVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  ulong uVar25;
  undefined4 uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  size_t index;
  BufferView<embree::Vec3fa> *pBVar33;
  size_t *psVar34;
  ulong uVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar43;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  undefined1 auVar42 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar81;
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  float fVar90;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar87;
  float fVar89;
  undefined1 auVar88 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar91;
  undefined1 auVar92 [64];
  float fVar93;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar94;
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  unsigned_long local_108;
  size_t local_100;
  size_t local_f0;
  ulong uVar16;
  undefined1 auVar71 [64];
  undefined1 auVar77 [64];
  undefined1 auVar80 [64];
  undefined1 auVar83 [64];
  
  aVar81.m128[2] = INFINITY;
  aVar81._0_8_ = 0x7f8000007f800000;
  aVar81.m128[3] = INFINITY;
  auVar83 = ZEXT1664((undefined1  [16])aVar81);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar81;
  aVar66.m128[2] = -INFINITY;
  aVar66._0_8_ = 0xff800000ff800000;
  aVar66.m128[3] = -INFINITY;
  auVar71 = ZEXT1664((undefined1  [16])aVar66);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar66;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar81;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar66;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar81;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar66;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar76._8_4_ = 0x3f800000;
  auVar76._0_8_ = &DAT_3f8000003f800000;
  auVar76._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar76);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar1;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar21 = r->_begin;
  auVar78._8_8_ = 0;
  auVar78._0_4_ = (__return_storage_ptr__->time_range).lower;
  auVar78._4_4_ = (__return_storage_ptr__->time_range).upper;
  auVar80 = ZEXT1664(auVar78);
  local_100 = __return_storage_ptr__->num_time_segments;
  uVar16 = __return_storage_ptr__->max_num_time_segments;
  auVar72._8_8_ = 0;
  auVar72._0_4_ = (__return_storage_ptr__->max_time_range).lower;
  auVar72._4_4_ = (__return_storage_ptr__->max_time_range).upper;
  auVar77 = ZEXT1664(auVar72);
  aVar94 = aVar81;
  aVar63 = aVar66;
  aVar91 = aVar81;
  aVar87 = aVar66;
  if (uVar21 < r->_end) {
    local_f0 = k;
    local_108 = (__return_storage_ptr__->object_range)._end;
    auVar96._8_4_ = 0xddccb9a2;
    auVar96._0_8_ = 0xddccb9a2ddccb9a2;
    auVar96._12_4_ = 0xddccb9a2;
    auVar97._8_4_ = 0x5dccb9a2;
    auVar97._0_8_ = 0x5dccb9a25dccb9a2;
    auVar97._12_4_ = 0x5dccb9a2;
    auVar95 = ZEXT1664((undefined1  [16])aVar81);
    auVar64 = ZEXT1664((undefined1  [16])aVar66);
    auVar92 = ZEXT1664((undefined1  [16])aVar81);
    auVar88 = ZEXT1664((undefined1  [16])aVar66);
    do {
      BVar2 = (this->super_GridMesh).super_Geometry.time_range;
      auVar40._8_8_ = 0;
      auVar40._0_4_ = BVar2.lower;
      auVar40._4_4_ = BVar2.upper;
      fVar37 = BVar2.lower;
      auVar76 = vmovshdup_avx(auVar40);
      fVar12 = auVar76._0_4_ - fVar37;
      if (uVar21 < *(ulong *)&(this->super_GridMesh).field_0x70) {
        lVar5 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
        uVar22 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
        lVar30 = *(long *)&(this->super_GridMesh).field_0x68 * uVar21;
        uVar18 = *(uint *)(lVar5 + lVar30);
        if (uVar18 < uVar22) {
          uVar3 = *(ushort *)(lVar5 + 10 + lVar30);
          uVar17 = (ulong)uVar3;
          uVar28 = *(uint *)(lVar5 + 4 + lVar30);
          uVar4 = *(ushort *)(lVar5 + 8 + lVar30);
          if (((uint)uVar4 + uVar28 * (uVar3 - 1) + uVar18) - 1 < uVar22) {
            bVar36 = uVar17 != 0;
            if (bVar36) {
              fVar43 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
              auVar76 = ZEXT416((uint)(fVar43 * ((t0t1->lower - fVar37) / fVar12) * 1.0000002));
              auVar76 = vroundss_avx(auVar76,auVar76,9);
              auVar76 = vmaxss_avx(ZEXT816(0),auVar76);
              uVar29 = (uint)auVar76._0_4_;
              auVar76 = ZEXT416((uint)(fVar43 * ((t0t1->upper - fVar37) / fVar12) * 0.99999976));
              auVar76 = vroundss_avx(auVar76,auVar76,10);
              auVar76 = vminss_avx(auVar76,ZEXT416((uint)fVar43));
              uVar22 = 0;
              do {
                if (uVar4 != 0) {
                  uVar35 = 0;
                  do {
                    if (uVar29 <= (uint)(int)auVar76._0_4_) {
                      uVar24 = (long)(int)uVar29;
                      psVar34 = &(this->super_GridMesh).vertices.items[(int)uVar29].
                                 super_RawBufferView.stride;
                      do {
                        auVar72 = vcmpps_avx(*(undefined1 (*) [16])
                                              (((RawBufferView *)(psVar34 + -2))->ptr_ofs +
                                              *psVar34 * (uVar22 * uVar28 + (ulong)uVar18 + uVar35))
                                             ,auVar96,6);
                        auVar78 = vcmpps_avx(*(undefined1 (*) [16])
                                              (((RawBufferView *)(psVar34 + -2))->ptr_ofs +
                                              *psVar34 * (uVar22 * uVar28 + (ulong)uVar18 + uVar35))
                                             ,auVar97,1);
                        auVar72 = vandps_avx(auVar72,auVar78);
                        uVar26 = vmovmskps_avx(auVar72);
                        if ((~(byte)uVar26 & 7) != 0) {
                          if (bVar36) goto LAB_01a4cfb7;
                          goto LAB_01a4cf9d;
                        }
                        uVar24 = uVar24 + 1;
                        psVar34 = psVar34 + 7;
                      } while (uVar24 <= (ulong)(long)(int)auVar76._0_4_);
                    }
                    uVar35 = uVar35 + 1;
                  } while (uVar35 != uVar4);
                }
                uVar22 = uVar22 + 1;
                bVar36 = uVar22 < uVar17;
              } while (uVar22 != uVar17);
            }
LAB_01a4cf9d:
            lVar5 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
            lVar30 = *(long *)&(this->super_GridMesh).field_0x68 * uVar21;
            if (*(short *)(lVar5 + 10 + lVar30) != 1) {
              uVar18 = 0;
              do {
                uVar3 = *(ushort *)(lVar5 + 8 + lVar30);
                uVar28 = (uint)uVar3;
                if (uVar3 != 1) {
                  uVar17 = (ulong)uVar18;
                  uVar35 = 0;
                  uVar22 = uVar16;
                  do {
                    auVar40 = auVar80._0_16_;
                    fVar12 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
                    fVar37 = (this->super_GridMesh).super_Geometry.time_range.lower;
                    fVar38 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar37;
                    fVar93 = (t0t1->lower - fVar37) / fVar38;
                    fVar38 = (t0t1->upper - fVar37) / fVar38;
                    fVar37 = fVar12 * fVar93;
                    fVar43 = fVar12 * fVar38;
                    auVar72 = vroundss_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),9);
                    auVar76 = vmaxss_avx(auVar72,ZEXT416(0));
                    iVar13 = (int)auVar76._0_4_;
                    auVar78 = vroundss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),10);
                    iVar19 = (int)auVar72._0_4_;
                    if (iVar19 < 0) {
                      iVar19 = -1;
                    }
                    uVar16 = uVar35 + 3;
                    iVar20 = (int)fVar12 + 1;
                    if ((int)auVar78._0_4_ < (int)fVar12 + 1) {
                      iVar20 = (int)auVar78._0_4_;
                    }
                    uVar3 = *(ushort *)(lVar5 + 10 + lVar30);
                    uVar27 = (ulong)uVar3;
                    uVar24 = uVar27;
                    if (uVar17 + 3 < uVar27) {
                      uVar24 = uVar17 + 3;
                    }
                    uVar31 = (ulong)uVar28;
                    auVar100._8_4_ = 0x7f800000;
                    auVar100._0_8_ = 0x7f8000007f800000;
                    auVar100._12_4_ = 0x7f800000;
                    auVar98._8_4_ = 0xff800000;
                    auVar98._0_8_ = 0xff800000ff800000;
                    auVar98._12_4_ = 0xff800000;
                    uVar29 = (uint)uVar35;
                    if (uVar17 < uVar27) {
                      pBVar33 = (this->super_GridMesh).vertices.items + iVar13;
                      uVar27 = uVar31;
                      if (uVar16 < uVar31) {
                        uVar27 = uVar16;
                      }
                      bVar36 = true;
                      auVar80 = ZEXT1664(CONCAT412(0xff800000,
                                                   CONCAT48(0xff800000,0xff800000ff800000)));
                      auVar65 = ZEXT1664(CONCAT412(0x7f800000,
                                                   CONCAT48(0x7f800000,0x7f8000007f800000)));
                      uVar25 = uVar17;
                      do {
                        if (uVar29 < uVar28) {
                          sVar6 = (pBVar33->super_RawBufferView).stride;
                          pauVar23 = (undefined1 (*) [16])
                                     ((pBVar33->super_RawBufferView).ptr_ofs +
                                     (*(uint *)(lVar5 + lVar30) + uVar35 +
                                     *(uint *)(lVar5 + 4 + lVar30) * uVar25) * sVar6);
                          lVar32 = uVar27 - uVar35;
                          do {
                            auVar72 = *pauVar23;
                            auVar100 = vcmpps_avx(auVar72,auVar96,6);
                            auVar98 = vcmpps_avx(auVar72,auVar97,1);
                            auVar100 = vandps_avx(auVar100,auVar98);
                            uVar26 = vmovmskps_avx(auVar100);
                            if ((~(byte)uVar26 & 7) != 0) {
                              auVar100._8_4_ = 0x7f800000;
                              auVar100._0_8_ = 0x7f8000007f800000;
                              auVar100._12_4_ = 0x7f800000;
                              auVar98._8_4_ = 0xff800000;
                              auVar98._0_8_ = 0xff800000ff800000;
                              auVar98._12_4_ = 0xff800000;
                              if (!bVar36) {
                                auVar100 = auVar65._0_16_;
                                auVar98 = auVar80._0_16_;
                              }
                              goto LAB_01a4d1d7;
                            }
                            auVar100 = vminps_avx(auVar65._0_16_,auVar72);
                            auVar65 = ZEXT1664(auVar100);
                            auVar72 = vmaxps_avx(auVar80._0_16_,auVar72);
                            auVar80 = ZEXT1664(auVar72);
                            pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar6);
                            lVar32 = lVar32 + -1;
                          } while (lVar32 != 0);
                        }
                        uVar25 = uVar25 + 1;
                        bVar36 = uVar25 < uVar24;
                        auVar100 = auVar65._0_16_;
                        auVar98 = auVar80._0_16_;
                      } while (uVar25 != uVar24);
                    }
LAB_01a4d1d7:
                    auVar72 = vminss_avx(auVar78,ZEXT416((uint)fVar12));
                    fVar39 = auVar72._0_4_;
                    iVar14 = (int)fVar39;
                    auVar41._8_4_ = 0x7f800000;
                    auVar41._0_8_ = 0x7f8000007f800000;
                    auVar41._12_4_ = 0x7f800000;
                    auVar84._8_4_ = 0xff800000;
                    auVar84._0_8_ = 0xff800000ff800000;
                    auVar84._12_4_ = 0xff800000;
                    if (uVar18 < uVar3) {
                      pBVar33 = (this->super_GridMesh).vertices.items + iVar14;
                      uVar27 = uVar31;
                      if (uVar16 < uVar31) {
                        uVar27 = uVar16;
                      }
                      bVar36 = true;
                      auVar80 = ZEXT1664(CONCAT412(0xff800000,
                                                   CONCAT48(0xff800000,0xff800000ff800000)));
                      auVar65 = ZEXT1664(CONCAT412(0x7f800000,
                                                   CONCAT48(0x7f800000,0x7f8000007f800000)));
                      uVar25 = uVar17;
                      do {
                        if (uVar29 < uVar28) {
                          sVar6 = (pBVar33->super_RawBufferView).stride;
                          pauVar23 = (undefined1 (*) [16])
                                     ((pBVar33->super_RawBufferView).ptr_ofs +
                                     (*(uint *)(lVar5 + lVar30) + uVar35 +
                                     *(uint *)(lVar5 + 4 + lVar30) * uVar25) * sVar6);
                          lVar32 = uVar27 - uVar35;
                          do {
                            auVar72 = *pauVar23;
                            auVar78 = vcmpps_avx(auVar72,auVar96,6);
                            auVar84 = vcmpps_avx(auVar72,auVar97,1);
                            auVar78 = vandps_avx(auVar78,auVar84);
                            uVar26 = vmovmskps_avx(auVar78);
                            if ((~(byte)uVar26 & 7) != 0) {
                              auVar41._8_4_ = 0x7f800000;
                              auVar41._0_8_ = 0x7f8000007f800000;
                              auVar41._12_4_ = 0x7f800000;
                              auVar84._8_4_ = 0xff800000;
                              auVar84._0_8_ = 0xff800000ff800000;
                              auVar84._12_4_ = 0xff800000;
                              if (!bVar36) {
                                auVar84 = auVar80._0_16_;
                                auVar41 = auVar65._0_16_;
                              }
                              goto LAB_01a4d2b8;
                            }
                            auVar78 = vminps_avx(auVar65._0_16_,auVar72);
                            auVar65 = ZEXT1664(auVar78);
                            auVar72 = vmaxps_avx(auVar80._0_16_,auVar72);
                            auVar80 = ZEXT1664(auVar72);
                            pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar6);
                            lVar32 = lVar32 + -1;
                          } while (lVar32 != 0);
                        }
                        uVar25 = uVar25 + 1;
                        bVar36 = uVar25 < uVar24;
                        auVar84 = auVar80._0_16_;
                        auVar41 = auVar65._0_16_;
                      } while (uVar25 != uVar24);
                    }
LAB_01a4d2b8:
                    auVar76 = ZEXT416((uint)(fVar37 - auVar76._0_4_));
                    if (iVar20 - iVar19 == 1) {
                      auVar76 = vmaxss_avx(auVar76,ZEXT816(0) << 0x40);
                      fVar37 = auVar76._0_4_;
                      fVar12 = 1.0 - fVar37;
                      auVar57._0_4_ = fVar37 * auVar41._0_4_;
                      auVar57._4_4_ = fVar37 * auVar41._4_4_;
                      auVar57._8_4_ = fVar37 * auVar41._8_4_;
                      auVar57._12_4_ = fVar37 * auVar41._12_4_;
                      auVar52._4_4_ = fVar12;
                      auVar52._0_4_ = fVar12;
                      auVar52._8_4_ = fVar12;
                      auVar52._12_4_ = fVar12;
                      auVar101 = vfmadd231ps_fma(auVar57,auVar52,auVar100);
                      auVar46._0_4_ = auVar84._0_4_ * fVar37;
                      auVar46._4_4_ = auVar84._4_4_ * fVar37;
                      auVar46._8_4_ = auVar84._8_4_ * fVar37;
                      auVar46._12_4_ = auVar84._12_4_ * fVar37;
                      auVar99 = vfmadd231ps_fma(auVar46,auVar98,auVar52);
                      auVar76 = vmaxss_avx(ZEXT416((uint)(fVar39 - fVar43)),ZEXT816(0) << 0x40);
                      fVar37 = auVar76._0_4_;
                      fVar12 = 1.0 - fVar37;
                      auVar67._0_4_ = auVar100._0_4_ * fVar37;
                      auVar67._4_4_ = auVar100._4_4_ * fVar37;
                      auVar67._8_4_ = auVar100._8_4_ * fVar37;
                      auVar67._12_4_ = auVar100._12_4_ * fVar37;
                      auVar59._4_4_ = fVar12;
                      auVar59._0_4_ = fVar12;
                      auVar59._8_4_ = fVar12;
                      auVar59._12_4_ = fVar12;
                      auVar42 = vfmadd213ps_fma(auVar41,auVar59,auVar67);
                      auVar53._0_4_ = auVar98._0_4_ * fVar37;
                      auVar53._4_4_ = auVar98._4_4_ * fVar37;
                      auVar53._8_4_ = auVar98._8_4_ * fVar37;
                      auVar53._12_4_ = auVar98._12_4_ * fVar37;
                      auVar85 = vfmadd213ps_fma(auVar84,auVar59,auVar53);
                    }
                    else {
                      auVar47._8_4_ = 0x7f800000;
                      auVar47._0_8_ = 0x7f8000007f800000;
                      auVar47._12_4_ = 0x7f800000;
                      auVar79._8_4_ = 0xff800000;
                      auVar79._0_8_ = 0xff800000ff800000;
                      auVar79._12_4_ = 0xff800000;
                      if (uVar18 < uVar3) {
                        pBVar33 = (this->super_GridMesh).vertices.items;
                        uVar27 = uVar31;
                        if (uVar16 < uVar31) {
                          uVar27 = uVar16;
                        }
                        bVar36 = true;
                        auVar80 = ZEXT1664(CONCAT412(0xff800000,
                                                     CONCAT48(0xff800000,0xff800000ff800000)));
                        auVar65 = ZEXT1664(CONCAT412(0x7f800000,
                                                     CONCAT48(0x7f800000,0x7f8000007f800000)));
                        uVar25 = uVar17;
                        do {
                          if (uVar29 < uVar28) {
                            sVar6 = pBVar33[(long)iVar13 + 1].super_RawBufferView.stride;
                            pauVar23 = (undefined1 (*) [16])
                                       (pBVar33[(long)iVar13 + 1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar5 + lVar30) + uVar35 +
                                       *(uint *)(lVar5 + 4 + lVar30) * uVar25) * sVar6);
                            lVar32 = uVar27 - uVar35;
                            do {
                              auVar72 = *pauVar23;
                              auVar78 = vcmpps_avx(auVar72,auVar96,6);
                              auVar79 = vcmpps_avx(auVar72,auVar97,1);
                              auVar78 = vandps_avx(auVar78,auVar79);
                              uVar26 = vmovmskps_avx(auVar78);
                              if ((~(byte)uVar26 & 7) != 0) {
                                auVar47._8_4_ = 0x7f800000;
                                auVar47._0_8_ = 0x7f8000007f800000;
                                auVar47._12_4_ = 0x7f800000;
                                auVar79._8_4_ = 0xff800000;
                                auVar79._0_8_ = 0xff800000ff800000;
                                auVar79._12_4_ = 0xff800000;
                                if (!bVar36) {
                                  auVar79 = auVar80._0_16_;
                                  auVar47 = auVar65._0_16_;
                                }
                                goto LAB_01a4d3fd;
                              }
                              auVar78 = vminps_avx(auVar65._0_16_,auVar72);
                              auVar65 = ZEXT1664(auVar78);
                              auVar72 = vmaxps_avx(auVar80._0_16_,auVar72);
                              auVar80 = ZEXT1664(auVar72);
                              pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar6);
                              lVar32 = lVar32 + -1;
                            } while (lVar32 != 0);
                          }
                          uVar25 = uVar25 + 1;
                          bVar36 = uVar25 < uVar24;
                          auVar79 = auVar80._0_16_;
                          auVar47 = auVar65._0_16_;
                        } while (uVar25 != uVar24);
                      }
LAB_01a4d3fd:
                      auVar82._8_4_ = 0x7f800000;
                      auVar82._0_8_ = 0x7f8000007f800000;
                      auVar82._12_4_ = 0x7f800000;
                      auVar58._8_4_ = 0xff800000;
                      auVar58._0_8_ = 0xff800000ff800000;
                      auVar58._12_4_ = 0xff800000;
                      if (uVar18 < uVar3) {
                        pBVar33 = (this->super_GridMesh).vertices.items;
                        uVar27 = uVar31;
                        if (uVar16 < uVar31) {
                          uVar27 = uVar16;
                        }
                        bVar36 = true;
                        auVar80 = ZEXT1664(CONCAT412(0xff800000,
                                                     CONCAT48(0xff800000,0xff800000ff800000)));
                        auVar65 = ZEXT1664(CONCAT412(0x7f800000,
                                                     CONCAT48(0x7f800000,0x7f8000007f800000)));
                        uVar25 = uVar17;
                        do {
                          if (uVar29 < uVar28) {
                            sVar6 = pBVar33[(long)iVar14 + -1].super_RawBufferView.stride;
                            pauVar23 = (undefined1 (*) [16])
                                       (pBVar33[(long)iVar14 + -1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar5 + lVar30) + uVar35 +
                                       *(uint *)(lVar5 + 4 + lVar30) * uVar25) * sVar6);
                            lVar32 = uVar27 - uVar35;
                            do {
                              auVar72 = *pauVar23;
                              auVar78 = vcmpps_avx(auVar72,auVar96,6);
                              auVar58 = vcmpps_avx(auVar72,auVar97,1);
                              auVar78 = vandps_avx(auVar78,auVar58);
                              uVar26 = vmovmskps_avx(auVar78);
                              if ((~(byte)uVar26 & 7) != 0) {
                                auVar82._8_4_ = 0x7f800000;
                                auVar82._0_8_ = 0x7f8000007f800000;
                                auVar82._12_4_ = 0x7f800000;
                                auVar58._8_4_ = 0xff800000;
                                auVar58._0_8_ = 0xff800000ff800000;
                                auVar58._12_4_ = 0xff800000;
                                if (!bVar36) {
                                  auVar58 = auVar80._0_16_;
                                  auVar82 = auVar65._0_16_;
                                }
                                goto LAB_01a4d4ca;
                              }
                              auVar78 = vminps_avx(auVar65._0_16_,auVar72);
                              auVar65 = ZEXT1664(auVar78);
                              auVar72 = vmaxps_avx(auVar80._0_16_,auVar72);
                              auVar80 = ZEXT1664(auVar72);
                              pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar6);
                              lVar32 = lVar32 + -1;
                            } while (lVar32 != 0);
                          }
                          uVar25 = uVar25 + 1;
                          bVar36 = uVar25 < uVar24;
                          auVar58 = auVar80._0_16_;
                          auVar82 = auVar65._0_16_;
                        } while (uVar25 != uVar24);
                      }
LAB_01a4d4ca:
                      auVar76 = vmaxss_avx(auVar76,ZEXT816(0) << 0x40);
                      fVar44 = auVar76._0_4_;
                      fVar37 = 1.0 - fVar44;
                      auVar48._0_4_ = fVar44 * auVar47._0_4_;
                      auVar48._4_4_ = fVar44 * auVar47._4_4_;
                      auVar48._8_4_ = fVar44 * auVar47._8_4_;
                      auVar48._12_4_ = fVar44 * auVar47._12_4_;
                      auVar60._4_4_ = fVar37;
                      auVar60._0_4_ = fVar37;
                      auVar60._8_4_ = fVar37;
                      auVar60._12_4_ = fVar37;
                      auVar101 = vfmadd213ps_fma(auVar100,auVar60,auVar48);
                      auVar49._0_4_ = fVar44 * auVar79._0_4_;
                      auVar49._4_4_ = fVar44 * auVar79._4_4_;
                      auVar49._8_4_ = fVar44 * auVar79._8_4_;
                      auVar49._12_4_ = fVar44 * auVar79._12_4_;
                      auVar99 = vfmadd213ps_fma(auVar98,auVar60,auVar49);
                      auVar76 = vmaxss_avx(ZEXT416((uint)(fVar39 - fVar43)),ZEXT816(0) << 0x40);
                      fVar43 = auVar76._0_4_;
                      fVar37 = 1.0 - fVar43;
                      auVar61._0_4_ = auVar82._0_4_ * fVar43;
                      auVar61._4_4_ = auVar82._4_4_ * fVar43;
                      auVar61._8_4_ = auVar82._8_4_ * fVar43;
                      auVar61._12_4_ = auVar82._12_4_ * fVar43;
                      auVar54._4_4_ = fVar37;
                      auVar54._0_4_ = fVar37;
                      auVar54._8_4_ = fVar37;
                      auVar54._12_4_ = fVar37;
                      auVar42 = vfmadd213ps_fma(auVar41,auVar54,auVar61);
                      auVar50._0_4_ = fVar43 * auVar58._0_4_;
                      auVar50._4_4_ = fVar43 * auVar58._4_4_;
                      auVar50._8_4_ = fVar43 * auVar58._8_4_;
                      auVar50._12_4_ = fVar43 * auVar58._12_4_;
                      auVar85 = vfmadd213ps_fma(auVar84,auVar54,auVar50);
                      if ((int)(iVar19 + 1U) < iVar20) {
                        uVar27 = (ulong)(iVar19 + 1U);
                        if (uVar31 <= uVar16) {
                          uVar16 = uVar31;
                        }
                        auVar76 = auVar99;
                        auVar72 = auVar101;
                        do {
                          auVar62._8_4_ = 0x7f800000;
                          auVar62._0_8_ = 0x7f8000007f800000;
                          auVar62._12_4_ = 0x7f800000;
                          auVar68._8_4_ = 0xff800000;
                          auVar68._0_8_ = 0xff800000ff800000;
                          auVar68._12_4_ = 0xff800000;
                          if (uVar18 < uVar3) {
                            pBVar33 = (this->super_GridMesh).vertices.items + uVar27;
                            bVar36 = true;
                            auVar65 = ZEXT1664(CONCAT412(0xff800000,
                                                         CONCAT48(0xff800000,0xff800000ff800000)));
                            auVar80 = ZEXT1664(CONCAT412(0x7f800000,
                                                         CONCAT48(0x7f800000,0x7f8000007f800000)));
                            uVar31 = uVar17;
                            do {
                              if (uVar29 < uVar28) {
                                sVar6 = (pBVar33->super_RawBufferView).stride;
                                pauVar23 = (undefined1 (*) [16])
                                           ((pBVar33->super_RawBufferView).ptr_ofs +
                                           (*(uint *)(lVar5 + lVar30) + uVar35 +
                                           *(uint *)(lVar5 + 4 + lVar30) * uVar31) * sVar6);
                                lVar32 = uVar16 - uVar35;
                                do {
                                  auVar78 = *pauVar23;
                                  auVar100 = vcmpps_avx(auVar78,auVar96,6);
                                  auVar98 = vcmpps_avx(auVar78,auVar97,1);
                                  auVar100 = vandps_avx(auVar100,auVar98);
                                  uVar26 = vmovmskps_avx(auVar100);
                                  if ((~(byte)uVar26 & 7) != 0) {
                                    auVar62._8_4_ = 0x7f800000;
                                    auVar62._0_8_ = 0x7f8000007f800000;
                                    auVar62._12_4_ = 0x7f800000;
                                    auVar68._8_4_ = 0xff800000;
                                    auVar68._0_8_ = 0xff800000ff800000;
                                    auVar68._12_4_ = 0xff800000;
                                    if (!bVar36) {
                                      auVar62 = auVar80._0_16_;
                                      auVar68 = auVar65._0_16_;
                                    }
                                    goto LAB_01a4d616;
                                  }
                                  auVar100 = vminps_avx(auVar80._0_16_,auVar78);
                                  auVar80 = ZEXT1664(auVar100);
                                  auVar78 = vmaxps_avx(auVar65._0_16_,auVar78);
                                  auVar65 = ZEXT1664(auVar78);
                                  pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar6);
                                  lVar32 = lVar32 + -1;
                                } while (lVar32 != 0);
                              }
                              uVar31 = uVar31 + 1;
                              bVar36 = uVar31 < uVar24;
                              auVar62 = auVar80._0_16_;
                              auVar68 = auVar65._0_16_;
                            } while (uVar31 != uVar24);
                          }
LAB_01a4d616:
                          fVar45 = ((float)(int)uVar27 / fVar12 - fVar93) / (fVar38 - fVar93);
                          fVar37 = 1.0 - fVar45;
                          auVar73._0_4_ = auVar42._0_4_ * fVar45;
                          fVar43 = auVar42._4_4_;
                          auVar73._4_4_ = fVar43 * fVar45;
                          fVar39 = auVar42._8_4_;
                          auVar73._8_4_ = fVar39 * fVar45;
                          fVar44 = auVar42._12_4_;
                          auVar73._12_4_ = fVar44 * fVar45;
                          auVar55._4_4_ = fVar37;
                          auVar55._0_4_ = fVar37;
                          auVar55._8_4_ = fVar37;
                          auVar55._12_4_ = fVar37;
                          auVar78 = vfmadd231ps_fma(auVar73,auVar55,auVar72);
                          auVar78 = vsubps_avx(auVar62,auVar78);
                          auVar51._0_4_ = auVar85._0_4_ * fVar45;
                          fVar37 = auVar85._4_4_;
                          auVar51._4_4_ = fVar37 * fVar45;
                          fVar89 = auVar85._8_4_;
                          auVar51._8_4_ = fVar89 * fVar45;
                          fVar90 = auVar85._12_4_;
                          auVar51._12_4_ = fVar90 * fVar45;
                          auVar100 = vfmadd231ps_fma(auVar51,auVar76,auVar55);
                          auVar98 = vsubps_avx(auVar68,auVar100);
                          auVar100 = vminps_avx(auVar78,ZEXT816(0) << 0x40);
                          auVar78 = vmaxps_avx(auVar98,ZEXT816(0) << 0x40);
                          auVar101._0_4_ = auVar72._0_4_ + auVar100._0_4_;
                          auVar101._4_4_ = auVar72._4_4_ + auVar100._4_4_;
                          auVar101._8_4_ = auVar72._8_4_ + auVar100._8_4_;
                          auVar101._12_4_ = auVar72._12_4_ + auVar100._12_4_;
                          auVar42._0_4_ = auVar42._0_4_ + auVar100._0_4_;
                          auVar42._4_4_ = fVar43 + auVar100._4_4_;
                          auVar42._8_4_ = fVar39 + auVar100._8_4_;
                          auVar42._12_4_ = fVar44 + auVar100._12_4_;
                          auVar99._0_4_ = auVar76._0_4_ + auVar78._0_4_;
                          auVar99._4_4_ = auVar76._4_4_ + auVar78._4_4_;
                          auVar99._8_4_ = auVar76._8_4_ + auVar78._8_4_;
                          auVar99._12_4_ = auVar76._12_4_ + auVar78._12_4_;
                          auVar85._0_4_ = auVar85._0_4_ + auVar78._0_4_;
                          auVar85._4_4_ = fVar37 + auVar78._4_4_;
                          auVar85._8_4_ = fVar89 + auVar78._8_4_;
                          auVar85._12_4_ = fVar90 + auVar78._12_4_;
                          uVar27 = uVar27 + 1;
                          auVar76 = auVar99;
                          auVar72 = auVar101;
                        } while (iVar20 != (int)uVar27);
                      }
                    }
                    aVar8 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                            vinsertps_avx(auVar101,ZEXT416(geomID),0x30);
                    uVar15 = (this->super_GridMesh).super_Geometry.numTimeSteps - 1;
                    uVar16 = (ulong)uVar15;
                    BVar2 = (this->super_GridMesh).super_Geometry.time_range;
                    auVar56._8_8_ = 0;
                    auVar56._0_4_ = BVar2.lower;
                    auVar56._4_4_ = BVar2.upper;
                    aVar9 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                            vinsertps_avx(auVar99,ZEXT416((uint)local_f0),0x30);
                    auVar72 = vcmpps_avx(auVar40,auVar56,1);
                    auVar78 = vinsertps_avx(auVar40,auVar56,0x50);
                    auVar76 = vblendps_avx(auVar56,auVar40,2);
                    auVar76 = vblendvps_avx(auVar76,auVar78,auVar72);
                    auVar80 = ZEXT1664(auVar76);
                    aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                             vinsertps_avx(auVar42,ZEXT416(uVar15),0x30);
                    aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                             vinsertps_avx(auVar85,ZEXT416(uVar15),0x30);
                    auVar86._8_4_ = 0x3f000000;
                    auVar86._0_8_ = 0x3f0000003f000000;
                    auVar86._12_4_ = 0x3f000000;
                    auVar69._0_4_ = aVar10.x * 0.5;
                    auVar69._4_4_ = aVar10.y * 0.5;
                    auVar69._8_4_ = aVar10.z * 0.5;
                    auVar69._12_4_ = aVar10.field_3.w * 0.5;
                    auVar76 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar8,auVar86);
                    auVar74._0_4_ = aVar11.x * 0.5;
                    auVar74._4_4_ = aVar11.y * 0.5;
                    auVar74._8_4_ = aVar11.z * 0.5;
                    auVar74._12_4_ = aVar11.field_3.w * 0.5;
                    auVar72 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar9,auVar86);
                    auVar70._0_4_ = auVar76._0_4_ + auVar72._0_4_;
                    auVar70._4_4_ = auVar76._4_4_ + auVar72._4_4_;
                    auVar70._8_4_ = auVar76._8_4_ + auVar72._8_4_;
                    auVar70._12_4_ = auVar76._12_4_ + auVar72._12_4_;
                    local_108 = local_108 + 1;
                    local_100 = local_100 + uVar16;
                    bVar36 = uVar22 < uVar16;
                    auVar75[1] = bVar36;
                    auVar75[0] = bVar36;
                    auVar75[2] = bVar36;
                    auVar75[3] = bVar36;
                    auVar75[4] = bVar36;
                    auVar75[5] = bVar36;
                    auVar75[6] = bVar36;
                    auVar75[7] = bVar36;
                    auVar75[8] = bVar36;
                    auVar75[9] = bVar36;
                    auVar75[10] = bVar36;
                    auVar75[0xb] = bVar36;
                    auVar75[0xc] = bVar36;
                    auVar75[0xd] = bVar36;
                    auVar75[0xe] = bVar36;
                    auVar75[0xf] = bVar36;
                    auVar76 = vpslld_avx(auVar75,0x1f);
                    auVar76 = vblendvps_avx(auVar77._0_16_,auVar56,auVar76);
                    auVar77 = ZEXT1664(auVar76);
                    auVar76 = vminps_avx(auVar92._0_16_,auVar70);
                    auVar92 = ZEXT1664(auVar76);
                    auVar76 = vmaxps_avx(auVar88._0_16_,auVar70);
                    auVar88 = ZEXT1664(auVar76);
                    if (uVar16 < uVar22) {
                      uVar16 = uVar22;
                    }
                    auVar76 = vminps_avx(auVar83._0_16_,(undefined1  [16])aVar8);
                    auVar83 = ZEXT1664(auVar76);
                    uVar15 = uVar29 + 2;
                    uVar35 = (ulong)uVar15;
                    sgrids->items[local_f0] =
                         (SubGridBuildData)
                         ((ulong)(uVar29 & 0xfffe | (uint)(uVar28 <= uVar15) << 0xf) |
                         (ulong)(uVar18 << 0x10 | (uint)((uint)uVar3 <= uVar18 + 2) << 0x1f) |
                         uVar21 << 0x20);
                    pPVar7 = prims->items;
                    pPVar7[local_f0].lbounds.bounds0.lower.field_0 = aVar8;
                    auVar76 = vmaxps_avx(auVar71._0_16_,(undefined1  [16])aVar9);
                    auVar71 = ZEXT1664(auVar76);
                    pPVar7[local_f0].lbounds.bounds0.upper.field_0 = aVar9;
                    auVar76 = vminps_avx(auVar95._0_16_,(undefined1  [16])aVar10);
                    auVar95 = ZEXT1664(auVar76);
                    pPVar7[local_f0].lbounds.bounds1.lower.field_0.field_1 = aVar10;
                    auVar76 = vmaxps_avx(auVar64._0_16_,(undefined1  [16])aVar11);
                    auVar64 = ZEXT1664(auVar76);
                    pPVar7[local_f0].lbounds.bounds1.upper.field_0.field_1 = aVar11;
                    pPVar7[local_f0].time_range = BVar2;
                    local_f0 = local_f0 + 1;
                    uVar28 = (uint)*(ushort *)(lVar5 + 8 + lVar30);
                    uVar22 = uVar16;
                  } while (uVar15 < uVar28 - 1);
                }
                uVar18 = uVar18 + 2;
              } while (uVar18 < *(ushort *)(lVar5 + 10 + lVar30) - 1);
            }
          }
        }
      }
LAB_01a4cfb7:
      aVar66 = auVar71._0_16_;
      aVar81 = auVar83._0_16_;
      auVar78 = auVar80._0_16_;
      auVar72 = auVar77._0_16_;
      uVar21 = uVar21 + 1;
    } while (uVar21 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_108;
    aVar94 = auVar95._0_16_;
    aVar63 = auVar64._0_16_;
    aVar91 = auVar92._0_16_;
    aVar87 = auVar88._0_16_;
  }
  auVar76 = vmovlhps_avx(auVar72,auVar78);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar81;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar66;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar94;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar63;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar91;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar87;
  __return_storage_ptr__->num_time_segments = local_100;
  __return_storage_ptr__->max_num_time_segments = uVar16;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar76._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar76._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar76._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar76._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const override
      {
        PrimInfoMB pinfoMB(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              const PrimRefMB prim(linearBounds(g,x,y,t0t1),numTimeSegments(),time_range,numTimeSegments(),unsigned(geomID),unsigned(k));
              pinfoMB.add_primref(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;
            }
          }
        }
        return pinfoMB;
      }